

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

wstring * __thiscall
mjs::cpp_quote_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,wstring_view *s)

{
  wchar_t wVar1;
  const_iterator pvVar2;
  char16_t local_3c;
  value_type c;
  const_iterator __end1;
  const_iterator __begin1;
  wstring_view *__range1;
  wstring_view *s_local;
  wstring *r;
  
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  __end1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::begin
                     ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)this);
  pvVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::end
                     ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)this);
  for (; __end1 != pvVar2; __end1 = __end1 + 1) {
    wVar1 = *__end1;
    if ((((wVar1 < L' ') || (L'\x7f' < wVar1)) || (wVar1 == L'\"')) || (wVar1 == L'\\')) {
      local_3c = (char16_t)wVar1;
      anon_unknown_2::cpp_quote_escape(__return_storage_ptr__,local_3c);
    }
    else {
      std::__cxx11::wstring::operator+=((wstring *)__return_storage_ptr__,wVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring cpp_quote(const std::wstring_view& s) {
    std::wstring r;
    for (const auto c: s) {
        if (c < 32 || c > 127 || c == '\"' || c == '\\') {
            cpp_quote_escape(r, c);
        } else {
            r += c;
        }
    }
    return r;
}